

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_list_removefirst(QcList *list,void *data)

{
  QcListEntry *entry_00;
  undefined8 in_R8;
  undefined8 in_R9;
  QcListEntry *entry;
  void *data_local;
  QcList *list_local;
  
  if (list == (QcList *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
            ,0x2da,in_R8,in_R9,0);
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                  ,0x2da,"int qc_list_removefirst(QcList *, void *)");
  }
  qc_list_enumbegin(list);
  entry_00 = qc_list_enumentry(list);
  while( true ) {
    if (entry_00 == (QcListEntry *)0x0) {
      return -1;
    }
    if (entry_00->data == data) break;
    entry_00 = qc_list_enumentry(list);
  }
  qc_list_removeentry(list,entry_00);
  return 0;
}

Assistant:

int qc_list_removefirst(QcList *list, void *data){
    QcListEntry *entry = NULL;
    qc_assert(list);

    qc_list_enumbegin(list);

    entry = qc_list_enumentry(list);
    while(entry){
        if(entry->data == data){
            qc_list_removeentry(list, entry);
            return 0;
        }
        entry = qc_list_enumentry(list);
    }

    return -1;
}